

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargePropagator.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargePropagator::~FluctuatingChargePropagator(FluctuatingChargePropagator *this)

{
  code *pcVar1;
  FluctuatingChargePropagator *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

FluctuatingChargePropagator::~FluctuatingChargePropagator() {
    if (info_->usesFluctuatingCharges() && info_->getNFluctuatingCharges() > 0)
      delete fqConstraints_;
  }